

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLChar.cpp
# Opt level: O0

bool xercesc_4_0::XMLChar1_0::isPublicIdChar(XMLCh toCheck,XMLCh toCheck2)

{
  XMLCh XVar1;
  XMLCh *pXVar2;
  XMLCh *local_18;
  XMLCh *curTable;
  XMLCh toCheck2_local;
  XMLCh toCheck_local;
  
  if (toCheck2 != L'\0') {
    return false;
  }
  local_18 = L"#%\';?Zaz";
  while (*local_18 != L'\0') {
    pXVar2 = local_18 + 1;
    if ((ushort)toCheck < (ushort)*local_18) goto LAB_002be9de;
    local_18 = local_18 + 2;
    if ((ushort)toCheck <= (ushort)*pXVar2) {
      return true;
    }
  }
LAB_002bea1b:
  do {
    if (*local_18 == L'\0') {
      return false;
    }
    XVar1 = *local_18;
    local_18 = local_18 + 1;
  } while (toCheck != XVar1);
  return true;
LAB_002be9de:
  do {
    local_18 = pXVar2;
    pXVar2 = local_18 + 1;
    XVar1 = *local_18;
    local_18 = pXVar2;
  } while (XVar1 != L'\0');
  goto LAB_002bea1b;
}

Assistant:

bool XMLChar1_0::isPublicIdChar(const XMLCh toCheck, const XMLCh toCheck2)
{
    if (!toCheck2) {
        const XMLCh* curTable = gPublicIdChars;

        // Check the ranges
        while (*curTable)
        {
            //
            //  If the test char is less than the low range, then it's never
            //  going to match any other range, so break out. But we have to
            //  run up to the range terminator first.
            //
            if (toCheck < *curTable++)
            {
                while (*curTable++)
                {
                    // Purposefully empty, we are just running up the pointer
                }
                break;
            }

            // If it's less than or equal to the top of the range, then a match
            if (toCheck <= *curTable++)
                return true;
        }

        // And now test against singles
        while (*curTable)
        {
            if (toCheck == *curTable++)
                return true;
        }
        return false;
    }
    return false;
}